

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::
Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
::MergePartialFromCodedStream
          (Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
           *this,CodedInputStream *input)

{
  uint8 *puVar1;
  long *key;
  size_type sVar2;
  bool bVar3;
  unsigned_long uVar4;
  double *pdVar5;
  double *pdVar6;
  uint8 *puVar7;
  double *pdVar8;
  uint8 *puVar9;
  pair<unsigned_long,_bool> pVar10;
  byte local_29;
  double local_28;
  
  puVar7 = input->buffer_;
  puVar9 = input->buffer_end_;
  if ((puVar7 < puVar9) && (*puVar7 == '\b')) {
    puVar1 = puVar7 + 1;
    input->buffer_ = puVar1;
    if ((puVar9 <= puVar1) || (uVar4 = (unsigned_long)(char)*puVar1, (long)uVar4 < 0)) {
      pVar10 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar4 = pVar10.first;
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        puVar7 = input->buffer_;
        puVar9 = input->buffer_end_;
        goto LAB_001ddb14;
      }
LAB_001ddbff:
      local_29 = 0;
      goto LAB_001ddc01;
    }
    puVar7 = puVar7 + 2;
    input->buffer_ = puVar7;
LAB_001ddb14:
    key = &this->key_;
    *key = uVar4;
    if ((0 < (int)puVar9 - (int)puVar7) && (*puVar7 == '\x11')) {
      sVar2 = this->map_->elements_->num_elements_;
      pdVar5 = Map<long,_double>::operator[](this->map_,key);
      this->value_ptr_ = pdVar5;
      if (sVar2 != this->map_->elements_->num_elements_) {
        io::CodedInputStream::Skip(input,1);
        pdVar5 = this->value_ptr_;
        pdVar6 = (double *)input->buffer_;
        pdVar8 = (double *)input->buffer_end_;
        if ((int)pdVar8 - (int)pdVar6 < 8) {
          bVar3 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_28);
          if (!bVar3) {
            Map<long,_double>::erase(this->map_,key);
            goto LAB_001ddbff;
          }
          pdVar6 = (double *)input->buffer_;
          pdVar8 = (double *)input->buffer_end_;
        }
        else {
          local_28 = *pdVar6;
          pdVar6 = pdVar6 + 1;
          input->buffer_ = (uint8 *)pdVar6;
        }
        *pdVar5 = local_28;
        if ((pdVar6 == pdVar8) &&
           ((input->buffer_size_after_limit_ != 0 ||
            (input->total_bytes_read_ == input->current_limit_)))) {
          input->last_tag_ = 0;
          input->legitimate_message_end_ = true;
          local_29 = 1;
        }
        else {
          local_29 = ReadBeyondKeyValuePair(this,input);
        }
        goto LAB_001ddc01;
      }
    }
  }
  else {
    this->key_ = 0;
  }
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::MessageLite,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>
  ::
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::Map<long,double>>
  ::MergePartialFromCodedStream();
LAB_001ddc01:
  return (bool)(local_29 & 1);
}

Assistant:

bool MergePartialFromCodedStream(::google::protobuf::io::CodedInputStream* input) {
      // Look for the expected thing: a key and then a value.  If it fails,
      // invoke the enclosing class's MergePartialFromCodedStream, or return
      // false if that would be pointless.
      if (input->ExpectTag(kKeyTag)) {
        if (!KeyTypeHandler::Read(input, &key_)) {
          return false;
        }
        // Peek at the next byte to see if it is kValueTag.  If not, bail out.
        const void* data;
        int size;
        input->GetDirectBufferPointerInline(&data, &size);
        // We could use memcmp here, but we don't bother. The tag is one byte.
        GOOGLE_COMPILE_ASSERT(kTagSize == 1, tag_size_error);
        if (size > 0 && *reinterpret_cast<const char*>(data) == kValueTag) {
          typename Map::size_type size = map_->size();
          value_ptr_ = &(*map_)[key_];
          if (GOOGLE_PREDICT_TRUE(size != map_->size())) {
            // We created a new key-value pair.  Fill in the value.
            typedef
                typename MapIf<ValueTypeHandler::kIsEnum, int*, Value*>::type T;
            input->Skip(kTagSize);  // Skip kValueTag.
            if (!ValueTypeHandler::Read(input,
                                        reinterpret_cast<T>(value_ptr_))) {
              map_->erase(key_);  // Failure! Undo insertion.
              return false;
            }
            if (input->ExpectAtEnd()) return true;
            return ReadBeyondKeyValuePair(input);
          }
        }
      } else {
        key_ = Key();
      }

      entry_.reset(mf_->NewEntry());
      *entry_->mutable_key() = key_;
      const bool result = entry_->MergePartialFromCodedStream(input);
      if (result) UseKeyAndValueFromEntry();
      if (entry_->GetArena() != NULL) entry_.release();
      return result;
    }